

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

double DamageTypeDefinition::GetMobjDamageFactor(FName *type,DmgFactors *factors)

{
  DamageTypeDefinition *pDVar1;
  double *pdVar2;
  FName local_20;
  FName local_1c;
  FName local_18;
  FName local_14;
  
  local_18 = (FName)type->Index;
  if (factors == (DmgFactors *)0x0) {
    if (local_18.Index == 0) {
      return 1.0;
    }
    pDVar1 = Get(&local_18);
  }
  else {
    local_14.Index = local_18.Index;
    pDVar1 = (DamageTypeDefinition *)
             TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                       (&factors->
                         super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                        &local_14);
    if (pDVar1 != (DamageTypeDefinition *)0x0) goto LAB_003b35f8;
    if (type->Index == 0) {
      return 1.0;
    }
    local_1c.Index = 0;
    pdVar2 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                       (&factors->
                         super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                        &local_1c);
    local_20 = (FName)type->Index;
    pDVar1 = Get(&local_20);
    if (pdVar2 != (double *)0x0) {
      if (pDVar1 == (DamageTypeDefinition *)0x0) {
        return *pdVar2;
      }
      if (pDVar1->ReplaceFactor != true) {
        return *pdVar2 * pDVar1->DefaultFactor;
      }
      goto LAB_003b35f8;
    }
  }
  if (pDVar1 == (DamageTypeDefinition *)0x0) {
    return 1.0;
  }
LAB_003b35f8:
  return pDVar1->DefaultFactor;
}

Assistant:

double DamageTypeDefinition::GetMobjDamageFactor(FName type, DmgFactors const * const factors)
{
	if (factors)
	{
		// If the actor has named damage factors, look for a specific factor

		auto pdf = factors->CheckKey(type);
		if (pdf) return *pdf; // type specific damage type
		
		// If this was nonspecific damage, don't fall back to nonspecific search
		if (type == NAME_None) return 1.;
	}
	
	// If this was nonspecific damage, don't fall back to nonspecific search
	else if (type == NAME_None) 
	{ 
		return 1.;
	}
	else
	{
		// Normal is unsupplied / 1.0, so there's no difference between modifying and overriding
		DamageTypeDefinition *dtd = Get(type);
		return dtd ? dtd->DefaultFactor : 1.;
	}
	
	{
		auto pdf  = factors->CheckKey(NAME_None);
		DamageTypeDefinition *dtd = Get(type);
		// Here we are looking for modifications to untyped damage
		// If the calling actor defines untyped damage factor, that is contained in "pdf".
		if (pdf) // normal damage available
		{
			if (dtd)
			{
				if (dtd->ReplaceFactor) return dtd->DefaultFactor; // use default instead of untyped factor
				return *pdf * dtd->DefaultFactor; // use default as modification of untyped factor
			}
			return *pdf; // there was no default, so actor default is used
		}
		else if (dtd)
		{
			return dtd->DefaultFactor; // implicit untyped factor 1.0 does not need to be applied/replaced explicitly
		}
	}
	return 1.;
}